

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2enc.c
# Opt level: O2

int jpc_enc_encpkt(jpc_enc_t *enc,jas_stream_t *out,int compno,int lvlno,int prcno,uint lyrno)

{
  jpc_enc_cp_t *pjVar1;
  jpc_enc_tile_t *pjVar2;
  jpc_enc_rlvl_t *pjVar3;
  jpc_enc_prc_t *pjVar4;
  uint_fast16_t uVar5;
  uchar *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  jpc_bitstream_t *bitstream;
  jpc_tagtreenode_t *pjVar12;
  jpc_enc_cblk_t *pjVar13;
  jpc_enc_pass_t *pjVar14;
  jpc_enc_pass_t *pjVar15;
  jpc_ms_t *pjVar16;
  uint uVar17;
  uint uVar18;
  jpc_enc_band_t *pjVar19;
  char *__function;
  ulong v;
  jpc_enc_band_t *pjVar20;
  jas_stream_t *pjVar21;
  long lVar22;
  jpc_tagtree_t *pjVar23;
  jpc_enc_pass_t *pjVar24;
  jpc_enc_cblk_t *pjVar25;
  long lVar26;
  int iVar27;
  uint uVar28;
  int *piVar29;
  bool bVar30;
  
  iVar7 = jas_getdbglevel();
  if (9 < iVar7) {
    jas_eprintf("encoding packet begin %d %d %d %d\n",(ulong)(uint)compno,(ulong)(uint)lvlno,prcno);
  }
  pjVar1 = enc->cp;
  pjVar2 = enc->curtile;
  if (((pjVar1->tcp).csty & 2) != 0) {
    pjVar16 = jpc_ms_create(0xff91);
    if (pjVar16 == (jpc_ms_t *)0x0) {
      return -1;
    }
    *(long *)&pjVar16->parms = (long)pjVar2->pi->pktno;
    iVar27 = jpc_putms(out,enc->cstate,pjVar16);
    if (iVar27 != 0) {
      return -1;
    }
    jpc_ms_destroy(pjVar16);
  }
  bitstream = jpc_bitstream_sopen(out,"w+");
  if (bitstream == (jpc_bitstream_t *)0x0) {
    abort();
  }
  if ((bitstream->openmode_ & 2) == 0) {
    __assert_fail("(outb)->openmode_ & JPC_BITSTREAM_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                  ,0xd3,
                  "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)");
  }
  iVar8 = bitstream->cnt_;
  iVar27 = iVar8 + -1;
  bitstream->cnt_ = iVar27;
  if (iVar8 < 1) {
    uVar5 = bitstream->buf_;
    pjVar21 = bitstream->stream_;
    uVar17 = (uint)uVar5;
    uVar28 = uVar17 & 0xff;
    uVar18 = uVar28 == 0xff ^ 7;
    bitstream->cnt_ = uVar18;
    bitstream->buf_ = (ulong)(uVar28 << 8 | 1 << uVar18);
    uVar28 = pjVar21->flags_;
    if ((uVar28 & 7) != 0) {
      return -1;
    }
    if ((-1 < pjVar21->rwlimit_) && (pjVar21->rwlimit_ <= pjVar21->rwcnt_)) {
LAB_0012e0e0:
      pjVar21->flags_ = uVar28 | 4;
      return -1;
    }
    *(byte *)&pjVar21->bufmode_ = (byte)pjVar21->bufmode_ | 0x20;
    iVar27 = pjVar21->cnt_;
    pjVar21->cnt_ = iVar27 + -1;
    if (iVar27 < 1) {
      iVar27 = jas_stream_flushbuf(pjVar21,uVar17 & 0xff);
      if (iVar27 == -1) {
        return -1;
      }
    }
    else {
      pjVar21->rwcnt_ = pjVar21->rwcnt_ + 1;
      puVar6 = pjVar21->ptr_;
      pjVar21->ptr_ = puVar6 + 1;
      *puVar6 = (uchar)uVar5;
    }
  }
  else {
    bitstream->buf_ = bitstream->buf_ | (long)(1 << ((byte)iVar27 & 0x1f));
  }
  if (9 < iVar7) {
    jas_eprintf("present.\n");
  }
  pjVar3 = pjVar2->tcmpts[compno].rlvls;
  pjVar20 = pjVar3[lvlno].bands;
  pjVar19 = pjVar20 + pjVar3[lvlno].numbands;
  do {
    if (pjVar20 == pjVar19) {
      jpc_bitstream_outalign(bitstream,0);
      jpc_bitstream_close(bitstream);
      if (((pjVar1->tcp).csty & 4) != 0) {
        pjVar16 = jpc_ms_create(0xff92);
        if ((pjVar16 == (jpc_ms_t *)0x0) ||
           (iVar27 = jpc_putms(out,enc->cstate,pjVar16), iVar27 != 0)) {
          return -1;
        }
        jpc_ms_destroy(pjVar16);
      }
      pjVar3 = pjVar2->tcmpts[compno].rlvls;
      pjVar20 = pjVar3[lvlno].bands;
      pjVar19 = pjVar20 + pjVar3[lvlno].numbands;
      do {
        if (pjVar20 == pjVar19) {
          if (9 < iVar7) {
            jas_eprintf("encoding packet end\n");
            return 0;
          }
          return 0;
        }
        if (pjVar20->data != (jas_matrix_t *)0x0) {
          pjVar13 = pjVar20->prcs[prcno].cblks;
          if (pjVar13 != (jpc_enc_cblk_t *)0x0) {
            pjVar25 = pjVar13 + pjVar20->prcs[prcno].numcblks;
            for (; pjVar13 != pjVar25; pjVar13 = pjVar13 + 1) {
              pjVar15 = pjVar13->curpass;
              if (pjVar15 != (jpc_enc_pass_t *)0x0) {
                if (pjVar15->lyrno == lyrno) {
                  uVar28 = pjVar13->numpasses;
                  pjVar24 = pjVar13->passes;
                  for (lVar22 = 0;
                      (pjVar14 = (jpc_enc_pass_t *)((long)&pjVar15->start + lVar22),
                      pjVar14 != pjVar24 + uVar28 &&
                      (*(uint *)((long)&pjVar15->lyrno + lVar22) == lyrno)); lVar22 = lVar22 + 0x48)
                  {
                  }
                  jas_stream_seek(pjVar13->stream,(long)pjVar15->start,0);
                  pjVar21 = pjVar13->stream;
                  lVar26 = jas_stream_tell(pjVar21);
                  if (lVar26 != pjVar15->start) {
                    __assert_fail("jas_stream_tell(cblk->stream) == startpass->start",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                  ,0x17e,
                                  "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                                 );
                  }
                  iVar27 = jas_stream_copy(out,pjVar21,
                                           *(int *)((long)pjVar15 + lVar22 + -0x44) - pjVar15->start
                                          );
                  if (iVar27 != 0) {
                    return -1;
                  }
                  pjVar15 = (jpc_enc_pass_t *)0x0;
                  if (pjVar14 != pjVar24 + uVar28) {
                    pjVar15 = pjVar14;
                  }
                  pjVar13->curpass = pjVar15;
                  pjVar13->numencpasses = pjVar13->numencpasses + (int)(lVar22 / 0x48);
                }
                else if (pjVar15->lyrno <= lyrno) {
                  __assert_fail("pass->lyrno > lyrno",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                ,0x170,
                                "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                               );
                }
              }
            }
          }
        }
        pjVar20 = pjVar20 + 1;
      } while( true );
    }
    if (pjVar20->data != (jas_matrix_t *)0x0) {
      pjVar4 = pjVar20->prcs;
      pjVar13 = pjVar4[prcno].cblks;
      if (pjVar13 != (jpc_enc_cblk_t *)0x0) {
        piVar29 = &pjVar13->numimsbs;
        pjVar25 = pjVar13;
        for (lVar22 = (ulong)pjVar4[prcno].numcblks * 0x68; lVar22 != 0; lVar22 = lVar22 + -0x68) {
          if (lyrno == 0) {
            pjVar23 = pjVar4[prcno].nlibtree;
            pjVar12 = jpc_tagtree_getleaf(pjVar23,(int)(((long)pjVar13 - (long)pjVar4[prcno].cblks)
                                                       / 0x68));
            jpc_tagtree_setvalue(pjVar23,pjVar12,*piVar29);
          }
          if (((pjVar25->curpass != (jpc_enc_pass_t *)0x0) && (pjVar25->curpass->lyrno == lyrno)) &&
             (piVar29[-1] == 0)) {
            pjVar23 = pjVar4[prcno].incltree;
            pjVar12 = jpc_tagtree_getleaf(pjVar23,(int)(((long)pjVar13 - (long)pjVar4[prcno].cblks)
                                                       / 0x68));
            jpc_tagtree_setvalue(pjVar23,pjVar12,lyrno);
          }
          pjVar25 = pjVar25 + 1;
          piVar29 = piVar29 + 0x1a;
          pjVar13 = pjVar13 + 1;
        }
        pjVar13 = pjVar4[prcno].cblks;
        pjVar25 = pjVar13 + pjVar4[prcno].numcblks;
        for (; iVar27 = 1, pjVar13 != pjVar25; pjVar13 = pjVar13 + 1) {
          pjVar15 = pjVar13->curpass;
          if (pjVar15 == (jpc_enc_pass_t *)0x0) {
            bVar30 = false;
          }
          else {
            bVar30 = pjVar15->lyrno == lyrno;
          }
          if (pjVar13->numencpasses == 0) {
            pjVar23 = pjVar4[prcno].incltree;
            pjVar12 = jpc_tagtree_getleaf(pjVar23,(int)(((long)pjVar13 - (long)pjVar4[prcno].cblks)
                                                       / 0x68));
            iVar8 = jpc_tagtree_encode(pjVar23,pjVar12,lyrno + 1,bitstream);
            if (iVar8 < 0) {
              return -1;
            }
          }
          else {
            if ((bitstream->openmode_ & 2) == 0) {
              __assert_fail("(outb)->openmode_ & JPC_BITSTREAM_WRITE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                            ,0x101,
                            "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                           );
            }
            iVar10 = bitstream->cnt_;
            iVar8 = iVar10 + -1;
            bitstream->cnt_ = iVar8;
            if (iVar10 < 1) {
              uVar5 = bitstream->buf_;
              pjVar21 = bitstream->stream_;
              uVar17 = (uint)uVar5;
              uVar28 = uVar17 & 0xff;
              uVar18 = uVar28 == 0xff ^ 7;
              bitstream->cnt_ = uVar18;
              bitstream->buf_ = (ulong)((uint)bVar30 << (sbyte)uVar18 | uVar28 << 8);
              uVar28 = pjVar21->flags_;
              if ((uVar28 & 7) != 0) {
                return -1;
              }
              if ((-1 < pjVar21->rwlimit_) && (pjVar21->rwlimit_ <= pjVar21->rwcnt_))
              goto LAB_0012e0e0;
              *(byte *)&pjVar21->bufmode_ = (byte)pjVar21->bufmode_ | 0x20;
              iVar8 = pjVar21->cnt_;
              pjVar21->cnt_ = iVar8 + -1;
              if (iVar8 < 1) {
                iVar8 = jas_stream_flushbuf(pjVar21,uVar17 & 0xff);
                if (iVar8 == -1) {
                  return -1;
                }
              }
              else {
                pjVar21->rwcnt_ = pjVar21->rwcnt_ + 1;
                puVar6 = pjVar21->ptr_;
                pjVar21->ptr_ = puVar6 + 1;
                *puVar6 = (uchar)uVar5;
              }
            }
            else {
              bitstream->buf_ = bitstream->buf_ | (long)(int)((uint)bVar30 << ((byte)iVar8 & 0x1f));
            }
          }
          if (9 < iVar7) {
            jas_eprintf("included=%d ");
          }
          if (bVar30 != false) {
            if (pjVar13->numencpasses == 0) {
              pjVar23 = pjVar4[prcno].nlibtree;
              pjVar12 = jpc_tagtree_getleaf(pjVar23,(int)(((long)pjVar13 - (long)pjVar4[prcno].cblks
                                                          ) / 0x68));
              while( true ) {
                iVar8 = jpc_tagtree_encode(pjVar23,pjVar12,iVar27,bitstream);
                if (iVar8 < 0) {
                  return -1;
                }
                if (iVar8 != 0) break;
                iVar27 = iVar27 + 1;
                pjVar23 = pjVar4[prcno].nlibtree;
              }
              if ((pjVar12->known_ == 0) || (iVar27 - pjVar12->value_ != 1)) {
                __assert_fail("leaf->known_ && i == leaf->value_ + 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                              ,0x116,
                              "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                             );
              }
            }
            for (lVar22 = 0;
                ((jpc_enc_pass_t *)((long)&pjVar15->start + lVar22) !=
                 pjVar13->passes + pjVar13->numpasses &&
                (*(uint *)((long)&pjVar15->lyrno + lVar22) == lyrno)); lVar22 = lVar22 + 0x48) {
            }
            uVar28 = (uint)(lVar22 / 0x48);
            if ((int)uVar28 < 1) {
              return -1;
            }
            if (uVar28 == 2) {
              iVar27 = 2;
              v = 2;
LAB_0012dcfb:
              iVar27 = jpc_bitstream_putbits(bitstream,iVar27,v);
LAB_0012dd00:
              if (iVar27 == -1) {
                return -1;
              }
            }
            else {
              if (uVar28 != 1) {
                if (uVar28 < 6) {
                  v = (ulong)(uVar28 - 3) | 0xc;
                  iVar27 = 4;
                }
                else if (uVar28 < 0x25) {
                  v = (ulong)(uVar28 - 6) | 0x1e0;
                  iVar27 = 9;
                }
                else {
                  if (0xa4 < uVar28) {
                    return -1;
                  }
                  v = (ulong)(uVar28 - 0x25) | 0xff80;
                  iVar27 = 0x10;
                }
                goto LAB_0012dcfb;
              }
              if ((bitstream->openmode_ & 2) == 0) {
                __function = "int jpc_putnumnewpasses(jpc_bitstream_t *, int)";
                uVar28 = 0x72;
                goto LAB_0012e303;
              }
              iVar27 = bitstream->cnt_;
              bitstream->cnt_ = iVar27 + -1;
              if (iVar27 < 1) {
                uVar5 = bitstream->buf_;
                pjVar21 = bitstream->stream_;
                uVar17 = (uint)uVar5;
                uVar28 = uVar17 & 0xff;
                bitstream->buf_ = (ulong)(uVar28 << 8);
                bitstream->cnt_ = uVar28 == 0xff ^ 7;
                uVar28 = pjVar21->flags_;
                if ((uVar28 & 7) != 0) {
                  return -1;
                }
                if ((pjVar21->rwlimit_ < 0) || (pjVar21->rwcnt_ < pjVar21->rwlimit_)) {
                  *(byte *)&pjVar21->bufmode_ = (byte)pjVar21->bufmode_ | 0x20;
                  iVar27 = pjVar21->cnt_;
                  pjVar21->cnt_ = iVar27 + -1;
                  if (0 < iVar27) {
                    pjVar21->rwcnt_ = pjVar21->rwcnt_ + 1;
                    puVar6 = pjVar21->ptr_;
                    pjVar21->ptr_ = puVar6 + 1;
                    *puVar6 = (uchar)uVar5;
                    goto LAB_0012dd0e;
                  }
                  iVar27 = jas_stream_flushbuf(pjVar21,uVar17 & 0xff);
                  iVar27 = -(uint)(iVar27 == -1);
                  goto LAB_0012dd00;
                }
                goto LAB_0012e0e0;
              }
            }
LAB_0012dd0e:
            if (9 < iVar7) {
              jas_eprintf("numnewpasses=%d ");
            }
            pjVar14 = (jpc_enc_pass_t *)((long)&pjVar15[-1].start + lVar22);
            iVar27 = pjVar15->start;
            iVar8 = 0;
            iVar10 = 1;
            pjVar24 = pjVar15;
            for (lVar26 = 0; iVar11 = iVar8, lVar22 != lVar26; lVar26 = lVar26 + 0x48) {
              if (pjVar14 == pjVar24 || pjVar24->term != 0) {
                iVar11 = *(int *)((long)&pjVar15->end + lVar26);
                iVar9 = jpc_int_firstone(iVar11 - iVar27);
                iVar27 = pjVar13->numlenbits;
                iVar10 = jpc_floorlog2(iVar10);
                iVar27 = (iVar9 - (iVar10 + iVar27)) + 1;
                if (iVar8 < iVar27) {
                  iVar8 = iVar27;
                }
                if (iVar8 < 1) {
                  iVar8 = 0;
                }
                iVar10 = 1;
                iVar27 = iVar11;
              }
              else {
                iVar10 = iVar10 + 1;
              }
              pjVar24 = pjVar24 + 1;
            }
            for (; 0 < iVar11; iVar11 = iVar11 + -1) {
              if ((bitstream->openmode_ & 2U) == 0) {
                __function = "int jpc_putcommacode(jpc_bitstream_t *, int)";
                uVar28 = 0x61;
                goto LAB_0012e303;
              }
              iVar10 = bitstream->cnt_;
              iVar27 = iVar10 + -1;
              bitstream->cnt_ = iVar27;
              if (iVar10 < 1) {
                uVar5 = bitstream->buf_;
                pjVar21 = bitstream->stream_;
                uVar17 = (uint)uVar5;
                uVar28 = uVar17 & 0xff;
                uVar18 = uVar28 == 0xff ^ 7;
                bitstream->cnt_ = uVar18;
                bitstream->buf_ = (ulong)(uVar28 << 8 | 1 << uVar18);
                uVar28 = pjVar21->flags_;
                if ((uVar28 & 7) != 0) {
                  return -1;
                }
                if ((-1 < pjVar21->rwlimit_) && (pjVar21->rwlimit_ <= pjVar21->rwcnt_))
                goto LAB_0012e0e0;
                *(byte *)&pjVar21->bufmode_ = (byte)pjVar21->bufmode_ | 0x20;
                iVar27 = pjVar21->cnt_;
                pjVar21->cnt_ = iVar27 + -1;
                if (iVar27 < 1) {
                  iVar27 = jas_stream_flushbuf(pjVar21,uVar17 & 0xff);
                  if (iVar27 == -1) {
                    return -1;
                  }
                }
                else {
                  pjVar21->rwcnt_ = pjVar21->rwcnt_ + 1;
                  puVar6 = pjVar21->ptr_;
                  pjVar21->ptr_ = puVar6 + 1;
                  *puVar6 = (uchar)uVar5;
                }
              }
              else {
                bitstream->buf_ = bitstream->buf_ | (long)(1 << ((byte)iVar27 & 0x1f));
              }
            }
            if ((bitstream->openmode_ & 2U) == 0) {
              __function = "int jpc_putcommacode(jpc_bitstream_t *, int)";
              uVar28 = 0x65;
LAB_0012e303:
              __assert_fail("(out)->openmode_ & JPC_BITSTREAM_WRITE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                            ,uVar28,__function);
            }
            iVar27 = bitstream->cnt_;
            bitstream->cnt_ = iVar27 + -1;
            if (iVar27 < 1) {
              uVar5 = bitstream->buf_;
              pjVar21 = bitstream->stream_;
              uVar17 = (uint)uVar5;
              uVar28 = uVar17 & 0xff;
              bitstream->buf_ = (ulong)(uVar28 << 8);
              bitstream->cnt_ = uVar28 == 0xff ^ 7;
              uVar28 = pjVar21->flags_;
              if ((uVar28 & 7) != 0) {
                return -1;
              }
              if ((-1 < pjVar21->rwlimit_) && (pjVar21->rwlimit_ <= pjVar21->rwcnt_))
              goto LAB_0012e0e0;
              *(byte *)&pjVar21->bufmode_ = (byte)pjVar21->bufmode_ | 0x20;
              iVar27 = pjVar21->cnt_;
              pjVar21->cnt_ = iVar27 + -1;
              if (iVar27 < 1) {
                iVar27 = jas_stream_flushbuf(pjVar21,uVar17 & 0xff);
                if (iVar27 == -1) {
                  return -1;
                }
              }
              else {
                pjVar21->rwcnt_ = pjVar21->rwcnt_ + 1;
                puVar6 = pjVar21->ptr_;
                pjVar21->ptr_ = puVar6 + 1;
                *puVar6 = (uchar)uVar5;
              }
            }
            pjVar13->numlenbits = pjVar13->numlenbits + iVar8;
            iVar27 = pjVar15->start;
            iVar8 = 1;
            pjVar24 = pjVar15;
            for (lVar26 = 0; lVar22 != lVar26; lVar26 = lVar26 + 0x48) {
              if (pjVar14 == pjVar24 || pjVar24->term != 0) {
                iVar10 = *(int *)((long)&pjVar15->end + lVar26);
                iVar27 = iVar10 - iVar27;
                iVar9 = jpc_int_firstone(iVar27);
                iVar11 = pjVar13->numlenbits;
                iVar8 = jpc_floorlog2(iVar8);
                iVar8 = iVar8 + iVar11;
                if (iVar8 <= iVar9) {
                  __assert_fail("jpc_int_firstone(datalen) < cblk->numlenbits + jpc_floorlog2(passcount)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                ,0x142,
                                "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                               );
                }
                iVar11 = jpc_bitstream_putbits(bitstream,iVar8,(long)iVar27);
                iVar8 = 1;
                iVar27 = iVar10;
                if (iVar11 == -1) {
                  return -1;
                }
              }
              else {
                iVar8 = iVar8 + 1;
              }
              pjVar24 = pjVar24 + 1;
            }
          }
        }
      }
    }
    pjVar20 = pjVar20 + 1;
  } while( true );
}

Assistant:

int jpc_enc_encpkt(jpc_enc_t *enc, jas_stream_t *out, int compno, int lvlno, int prcno, unsigned lyrno)
{
	jpc_enc_tcmpt_t *comp;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_bitstream_t *outb;
	jpc_enc_pass_t *pass;
	jpc_enc_pass_t *startpass;
	jpc_enc_pass_t *lastpass;
	jpc_enc_pass_t *endpass;
	jpc_enc_pass_t *endpasses;
	int i;
	int included;
	int ret;
	jpc_tagtreenode_t *leaf;
	int n;
	int t1;
	int t2;
	int adjust;
	int maxadjust;
	int datalen;
	int numnewpasses;
	int passcount;
	jpc_enc_tile_t *tile;
	jpc_enc_prc_t *prc;
	jpc_enc_cp_t *cp;
	jpc_ms_t *ms;

	JAS_DBGLOG(10, ("encoding packet begin %d %d %d %d\n", compno, lvlno,
	  prcno, lyrno));

	tile = enc->curtile;
	cp = enc->cp;

	if (cp->tcp.csty & JPC_COD_SOP) {
		if (!(ms = jpc_ms_create(JPC_MS_SOP))) {
			return -1;
		}
		ms->parms.sop.seqno = jpc_pi_getind(tile->pi);
		if (jpc_putms(out, enc->cstate, ms)) {
			return -1;
		}
		jpc_ms_destroy(ms);
	}

	if (!(outb = jpc_bitstream_sopen(out, "w+"))) {
		abort();
	}

	if (jpc_bitstream_putbit(outb, 1) == EOF) {
		return -1;
	}
	//JAS_DBGLOG(10, ("\n"));
	JAS_DBGLOG(10, ("present.\n"));

	comp = &tile->tcmpts[compno];
	lvl = &comp->rlvls[lvlno];
	endbands = &lvl->bands[lvl->numbands];
	for (band = lvl->bands; band != endbands; ++band) {
		if (!band->data) {
			continue;
		}
		prc = &band->prcs[prcno];
		if (!prc->cblks) {
			continue;
		}

		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			if (!lyrno) {
				leaf = jpc_tagtree_getleaf(prc->nlibtree, cblk - prc->cblks);
				jpc_tagtree_setvalue(prc->nlibtree, leaf, cblk->numimsbs);
			}
			pass = cblk->curpass;
			included = (pass && pass->lyrno == lyrno);
			if (included && (!cblk->numencpasses)) {
				assert(pass->lyrno == lyrno);
				leaf = jpc_tagtree_getleaf(prc->incltree,
				  cblk - prc->cblks);
				jpc_tagtree_setvalue(prc->incltree, leaf, pass->lyrno);
			}
		}

		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			pass = cblk->curpass;
			included = (pass && pass->lyrno == lyrno);
			if (!cblk->numencpasses) {
				leaf = jpc_tagtree_getleaf(prc->incltree,
				  cblk - prc->cblks);
				if (jpc_tagtree_encode(prc->incltree, leaf, lyrno + 1, outb) <
				  0) {
					return -1;
				}
			} else {
				if (jpc_bitstream_putbit(outb, included) == EOF) {
					return -1;
				}
			}
			JAS_DBGLOG(10, ("included=%d ", included));
			if (!included) {
				continue;
			}
			if (!cblk->numencpasses) {
				i = 1;
				leaf = jpc_tagtree_getleaf(prc->nlibtree, cblk - prc->cblks);
				for (;;) {
					if ((ret = jpc_tagtree_encode(prc->nlibtree, leaf, i,
					  outb)) < 0) {
						return -1;
					}
					if (ret) {
						break;
					}
					++i;
				}
				assert(leaf->known_ && i == leaf->value_ + 1);
			}

			endpasses = &cblk->passes[cblk->numpasses];
			startpass = pass;
			endpass = startpass;
			while (endpass != endpasses && endpass->lyrno == lyrno){
				++endpass;
			}
			numnewpasses = endpass - startpass;
			if (jpc_putnumnewpasses(outb, numnewpasses)) {
				return -1;
			}
			JAS_DBGLOG(10, ("numnewpasses=%d ", numnewpasses));

			lastpass = endpass - 1;
			n = startpass->start;
			passcount = 1;
			maxadjust = 0;
			for (pass = startpass; pass != endpass; ++pass) {
				if (pass->term || pass == lastpass) {
					datalen = pass->end - n;
					t1 = jpc_int_firstone(datalen) + 1;
					t2 = cblk->numlenbits + jpc_floorlog2(passcount);
					adjust = JAS_MAX(t1 - t2, 0);
					maxadjust = JAS_MAX(adjust, maxadjust);
					n += datalen;
					passcount = 1;
				} else {
					++passcount;
				}
			}
			if (jpc_putcommacode(outb, maxadjust)) {
				return -1;
			}
			cblk->numlenbits += maxadjust;

			lastpass = endpass - 1;
			n = startpass->start;
			passcount = 1;
			for (pass = startpass; pass != endpass; ++pass) {
				if (pass->term || pass == lastpass) {
					datalen = pass->end - n;
					assert(jpc_int_firstone(datalen) < cblk->numlenbits +
					  jpc_floorlog2(passcount));
					if (jpc_bitstream_putbits(outb, cblk->numlenbits +
					  jpc_floorlog2(passcount), datalen) == EOF) {
						return -1;
					}
					n += datalen;
					passcount = 1;
				} else {
					++passcount;
				}
			}
		}
	}

	jpc_bitstream_outalign(outb, 0);
	jpc_bitstream_close(outb);

	if (cp->tcp.csty & JPC_COD_EPH) {
		if (!(ms = jpc_ms_create(JPC_MS_EPH))) {
			return -1;
		}
		if (jpc_putms(out, enc->cstate, ms)) {
			return -1;
		}
		jpc_ms_destroy(ms);
	}

	comp = &tile->tcmpts[compno];
	lvl = &comp->rlvls[lvlno];
	endbands = &lvl->bands[lvl->numbands];
	for (band = lvl->bands; band != endbands; ++band) {
		if (!band->data) {
			continue;
		}
		prc = &band->prcs[prcno];
		if (!prc->cblks) {
			continue;
		}
		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			pass = cblk->curpass;

			if (!pass) {
				continue;
			}
			if (pass->lyrno != lyrno) {
				assert(pass->lyrno > lyrno);
				continue;
			}

			endpasses = &cblk->passes[cblk->numpasses];
			startpass = pass;
			endpass = startpass;
			while (endpass != endpasses && endpass->lyrno == lyrno){
				++endpass;
			}
			lastpass = endpass - 1;
			numnewpasses = endpass - startpass;

			jas_stream_seek(cblk->stream, startpass->start, SEEK_SET);
			assert(jas_stream_tell(cblk->stream) == startpass->start);
			if (jas_stream_copy(out, cblk->stream, lastpass->end -
			  startpass->start)) {
				return -1;
			}
			cblk->curpass = (endpass != endpasses) ? endpass : 0;
			cblk->numencpasses += numnewpasses;

		}
	}

	JAS_DBGLOG(10, ("encoding packet end\n"));

	return 0;
}